

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void __thiscall
google::protobuf::SplitStringAllowEmpty
          (protobuf *this,StringPiece full,char *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  size_type sVar1;
  size_type pos;
  StringPiece local_80;
  string local_70;
  StringPiece local_50;
  StringPiece local_40;
  
  local_40.length_ = (size_type)full.ptr_;
  local_40.ptr_ = (char *)this;
  stringpiece_internal::StringPiece::StringPiece(&local_50,(char *)full.length_);
  pos = 0;
  sVar1 = stringpiece_internal::StringPiece::find_first_of(&local_40,local_50,0);
  if (sVar1 != 0xffffffffffffffff) {
    pos = 0;
    do {
      local_80 = stringpiece_internal::StringPiece::substr(&local_40,pos,sVar1 - pos);
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_70,&local_80);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pos = sVar1 + 1;
      stringpiece_internal::StringPiece::StringPiece(&local_50,(char *)full.length_);
      sVar1 = stringpiece_internal::StringPiece::find_first_of(&local_40,local_50,pos);
    } while (sVar1 != 0xffffffffffffffff);
  }
  local_80 = stringpiece_internal::StringPiece::substr(&local_40,pos,0xffffffffffffffff);
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_70,&local_80);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SplitStringAllowEmpty(StringPiece full, const char *delim,
                           std::vector<std::string> *result) {
  std::back_insert_iterator<std::vector<std::string> > it(*result);
  SplitStringToIteratorAllowEmpty(full, delim, 0, it);
}